

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SingleBindingCase::init
          (SingleBindingCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  EVP_PKEY_CTX *ctx_00;
  int local_32c;
  MessageBuilder local_328;
  int local_1a8 [6];
  MessageBuilder local_190;
  SingleBindingCase *local_10;
  SingleBindingCase *this_local;
  
  local_10 = this;
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [11])"Rendering ");
  local_1a8[2] = 0x14;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1a8 + 2);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xfb29fd);
  local_1a8[1] = 0x14;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1a8 + 1);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0xf7270e);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"Buffer format:\n");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"\tbufferOffset: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->m_spec).bufferOffset);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf12600);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"\tbufferStride: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->m_spec).bufferStride);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf12600);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [25])"Vertex position format:\n");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])"\ttype: float4\n");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])"\toffset: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->m_spec).positionAttrOffset);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf12600);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"\ttotal offset: ");
  local_1a8[0] = (this->m_spec).bufferOffset + (this->m_spec).positionAttrOffset;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1a8);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf12600);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  if (((this->m_spec).hasColorAttr & 1U) != 0) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    tcu::TestLog::operator<<(&local_328,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_328,(char (*) [8])"Color:\n");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])"\ttype: float4\n");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])"\toffset: ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->m_spec).colorAttrOffset);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf12600);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"\ttotal offset: ");
    local_32c = (this->m_spec).bufferOffset + (this->m_spec).colorAttrOffset;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_32c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xf12600);
    ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_328);
  }
  iVar1 = BindingRenderCase::init(&this->super_BindingRenderCase,ctx_00);
  return iVar1;
}

Assistant:

void SingleBindingCase::init (void)
{
	// log what we are trying to do

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Rendering " << (int)GRID_SIZE << "x" << (int)GRID_SIZE << " grid.\n"
						<< "Buffer format:\n"
						<< "	bufferOffset: " << m_spec.bufferOffset << "\n"
						<< "	bufferStride: " << m_spec.bufferStride << "\n"
						<< "Vertex position format:\n"
						<< "	type: float4\n"
						<< "	offset: " << m_spec.positionAttrOffset << "\n"
						<< "	total offset: " << m_spec.bufferOffset + m_spec.positionAttrOffset << "\n"
						<< tcu::TestLog::EndMessage;

	if (m_spec.hasColorAttr)
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Color:\n"
							<< "	type: float4\n"
							<< "	offset: " << m_spec.colorAttrOffset << "\n"
							<< "	total offset: " << m_spec.bufferOffset + m_spec.colorAttrOffset << "\n"
							<< tcu::TestLog::EndMessage;
	// init

	BindingRenderCase::init();
}